

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjCmp(jx9_value *pObj1,jx9_value *pObj2,int bStrict,int iNest)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  sxi32 sVar4;
  sxu32 local_7c;
  jx9_real r2;
  jx9_real r1;
  SyString s2;
  SyString s1;
  sxi32 iF2;
  sxi32 iF1;
  sxi32 rc;
  sxi32 iComb;
  int iNest_local;
  int bStrict_local;
  jx9_value *pObj2_local;
  jx9_value *pObj1_local;
  
  if ((bStrict == 0) || (pObj1->iFlags == pObj2->iFlags)) {
    uVar3 = pObj1->iFlags | pObj2->iFlags;
    if ((uVar3 & 0x108) == 0) {
      if ((uVar3 & 0x20) == 0) {
        if ((uVar3 & 0x40) != 0) {
          if ((pObj1->iFlags & 0x40U) == 0) {
            return -1;
          }
          if ((pObj2->iFlags & 0x40U) == 0) {
            return 1;
          }
          sVar4 = jx9HashmapCmp((jx9_hashmap *)(pObj1->x).pOther,(jx9_hashmap *)(pObj2->x).pOther,
                                bStrict);
          return sVar4;
        }
        if ((uVar3 & 1) != 0) {
          if ((pObj1->iFlags & 1U) == 0) {
            jx9MemObjToString(pObj1);
          }
          if ((pObj2->iFlags & 1U) == 0) {
            jx9MemObjToString(pObj2);
          }
          uVar3 = (pObj1->sBlob).nByte;
          uVar2 = (pObj2->sBlob).nByte;
          local_7c = uVar2;
          if (uVar3 < uVar2) {
            local_7c = uVar3;
          }
          iF2 = SyMemcmp((pObj1->sBlob).pBlob,(pObj2->sBlob).pBlob,local_7c);
          if (((iF2 == 0) && (uVar3 != uVar2)) && (iF2 = 1, uVar3 < uVar2)) {
            iF2 = -1;
          }
          return iF2;
        }
        if ((uVar3 & 6) != 0) {
          if ((pObj1->iFlags & 6U) == 0) {
            jx9MemObjToNumeric(pObj1);
          }
          if ((pObj2->iFlags & 6U) == 0) {
            jx9MemObjToNumeric(pObj2);
          }
          if ((pObj1->iFlags & pObj2->iFlags & 2U) == 0) {
            if ((pObj1->iFlags & 4U) == 0) {
              jx9MemObjToReal(pObj1);
            }
            dVar1 = (pObj1->x).rVal;
            if ((pObj2->iFlags & 4U) == 0) {
              jx9MemObjToReal(pObj2);
            }
            if ((pObj2->x).rVal < dVar1) {
              return 1;
            }
            if (dVar1 < (pObj2->x).rVal) {
              return -1;
            }
            return 0;
          }
          if ((pObj2->x).iVal < (pObj1->x).iVal) {
            return 1;
          }
          if ((pObj1->x).iVal < (pObj2->x).iVal) {
            return -1;
          }
          return 0;
        }
      }
      else {
        if ((pObj1->iFlags & 0x20U) == 0) {
          return 1;
        }
        if ((pObj2->iFlags & 0x20U) == 0) {
          return -1;
        }
      }
      pObj1_local._4_4_ = 0;
    }
    else {
      if ((pObj1->iFlags & 8U) == 0) {
        jx9MemObjToBool(pObj1);
      }
      if ((pObj2->iFlags & 8U) == 0) {
        jx9MemObjToBool(pObj2);
      }
      pObj1_local._4_4_ = (uint)((pObj1->x).iVal != 0) - (uint)((pObj2->x).iVal != 0);
    }
  }
  else {
    pObj1_local._4_4_ = 1;
  }
  return pObj1_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjCmp(jx9_value *pObj1, jx9_value *pObj2, int bStrict, int iNest)
{
	sxi32 iComb; 
	sxi32 rc;
	if( bStrict ){
		sxi32 iF1, iF2;
		/* Strict comparisons with === */
		iF1 = pObj1->iFlags;
		iF2 = pObj2->iFlags;
		if( iF1 != iF2 ){
			/* Not of the same type */
			return 1;
		}
	}
	/* Combine flag together */
	iComb = pObj1->iFlags|pObj2->iFlags;
	if( iComb & (MEMOBJ_RES|MEMOBJ_BOOL) ){
		/* Convert to boolean: Keep in mind FALSE < TRUE */
		if( (pObj1->iFlags & MEMOBJ_BOOL) == 0 ){
			jx9MemObjToBool(pObj1);
		}
		if( (pObj2->iFlags & MEMOBJ_BOOL) == 0 ){
			jx9MemObjToBool(pObj2);
		}
		return (sxi32)((pObj1->x.iVal != 0) - (pObj2->x.iVal != 0));
	}else if( iComb & MEMOBJ_NULL ){
		if( (pObj1->iFlags & MEMOBJ_NULL) == 0 ){
			return 1;
		}
		if( (pObj2->iFlags & MEMOBJ_NULL) == 0 ){
			return -1;
		}
	}else if ( iComb & MEMOBJ_HASHMAP ){
		/* Hashmap aka 'array' comparison */
		if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* Array is always greater */
			return -1;
		}
		if( (pObj2->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* Array is always greater */
			return 1;
		}
		/* Perform the comparison */
		rc = jx9HashmapCmp((jx9_hashmap *)pObj1->x.pOther, (jx9_hashmap *)pObj2->x.pOther, bStrict);
		return rc;
	}else if ( iComb & MEMOBJ_STRING ){
		SyString s1, s2;
		/* Perform a strict string comparison.*/
		if( (pObj1->iFlags&MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(pObj1);
		}
		if( (pObj2->iFlags&MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(pObj2);
		}
		SyStringInitFromBuf(&s1, SyBlobData(&pObj1->sBlob), SyBlobLength(&pObj1->sBlob));
		SyStringInitFromBuf(&s2, SyBlobData(&pObj2->sBlob), SyBlobLength(&pObj2->sBlob));
		/*
		 * Strings are compared using memcmp(). If one value is an exact prefix of the
		 * other, then the shorter value is less than the longer value.
		 */
		rc = SyMemcmp((const void *)s1.zString, (const void *)s2.zString, SXMIN(s1.nByte, s2.nByte));
		if( rc == 0 ){
			if( s1.nByte != s2.nByte ){
				rc = s1.nByte < s2.nByte ? -1 : 1;
			}
		}
		return rc;
	}else if( iComb & (MEMOBJ_INT|MEMOBJ_REAL) ){
		/* Perform a numeric comparison if one of the operand is numeric(integer or real) */
		if( (pObj1->iFlags & (MEMOBJ_INT|MEMOBJ_REAL)) == 0 ){
			jx9MemObjToNumeric(pObj1);
		}
		if( (pObj2->iFlags & (MEMOBJ_INT|MEMOBJ_REAL)) == 0 ){
			jx9MemObjToNumeric(pObj2);
		}
		if( (pObj1->iFlags & pObj2->iFlags & MEMOBJ_INT) == 0) {
			jx9_real r1, r2;
			/* Compare as reals */
			if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
				jx9MemObjToReal(pObj1);
			}
			r1 = pObj1->x.rVal;	
			if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
				jx9MemObjToReal(pObj2);
			}
			r2 = pObj2->x.rVal;
			if( r1 > r2 ){
				return 1;
			}else if( r1 < r2 ){
				return -1;
			}
			return 0;
		}else{
			/* Integer comparison */
			if( pObj1->x.iVal > pObj2->x.iVal ){
				return 1;
			}else if( pObj1->x.iVal < pObj2->x.iVal ){
				return -1;
			}
			return 0;
		}
	}
	/* NOT REACHED */
	SXUNUSED(iNest);
	return 0;
}